

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O2

leb_Heap * leb_CreateMinMax(int minDepth,int maxDepth)

{
  leb_Heap *leb;
  uint32_t *puVar1;
  
  if (maxDepth < 5) {
    __assert_fail("maxDepth >= 5 && \"maxDepth must be at least 5\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x24a,"leb_Heap *leb_CreateMinMax(int, int)");
  }
  if (0x1d < (uint)maxDepth) {
    __assert_fail("maxDepth <= 29 && \"maxDepth must be at most 29\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x24b,"leb_Heap *leb_CreateMinMax(int, int)");
  }
  if (minDepth < 0) {
    __assert_fail("minDepth >= 0 && \"minDepth must be at least 0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x24c,"leb_Heap *leb_CreateMinMax(int, int)");
  }
  if ((uint)minDepth <= (uint)maxDepth) {
    leb = (leb_Heap *)malloc(0x10);
    leb->minDepth = minDepth;
    leb->maxDepth = maxDepth;
    puVar1 = (uint32_t *)malloc((ulong)((uint)(4 << ((byte)maxDepth & 0x1f)) >> 3 & 0xfffffffc));
    leb->buffer = puVar1;
    if (puVar1 != (uint32_t *)0x0) {
      leb_ResetToRoot(leb);
      return leb;
    }
    __assert_fail("leb->buffer != __null && \"Memory allocation failed\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x253,"leb_Heap *leb_CreateMinMax(int, int)");
  }
  __assert_fail("minDepth <= maxDepth && \"minDepth must be less than maxDepth\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                ,0x24d,"leb_Heap *leb_CreateMinMax(int, int)");
}

Assistant:

LEBDEF leb_Heap *leb_CreateMinMax(int minDepth, int maxDepth)
{
    LEB_ASSERT(maxDepth >=  5 && "maxDepth must be at least 5");
    LEB_ASSERT(maxDepth <= 29 && "maxDepth must be at most 29");
    LEB_ASSERT(minDepth >=  0 && "minDepth must be at least 0");
    LEB_ASSERT(minDepth <= maxDepth && "minDepth must be less than maxDepth");
    leb_Heap *leb = (leb_Heap *)LEB_MALLOC(sizeof(*leb));

    leb->minDepth = minDepth;
    leb->maxDepth = maxDepth;
    leb->buffer = (uint32_t *)LEB_MALLOC(leb__HeapByteSize(maxDepth));
    LEB_ASSERT(leb->buffer != NULL && "Memory allocation failed");
    leb_ResetToRoot(leb);

    return leb;
}